

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

Gia_Man_t * Gia_ManBalance(Gia_Man_t *p,int fSimpleAnd,int fStrict,int fVerbose)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *p_00;
  
  if (fVerbose != 0) {
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  }
  if (fSimpleAnd == 0) {
    pGVar1 = Gia_ManDupMuxes(p,2);
  }
  else {
    pGVar1 = Gia_ManDup(p);
  }
  Gia_ManTransferTiming(pGVar1,p);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
  }
  p_00 = Gia_ManBalanceInt(pGVar1,fStrict);
  Gia_ManTransferTiming(p_00,pGVar1);
  if (fVerbose != 0) {
    Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar1);
  pGVar1 = Gia_ManDupNoMuxes(p_00,0);
  Gia_ManTransferTiming(pGVar1,p_00);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManBalance( Gia_Man_t * p, int fSimpleAnd, int fStrict, int fVerbose )
{
    Gia_Man_t * pNew, * pNew1, * pNew2;
    if ( fVerbose )      Gia_ManPrintStats( p, NULL );
    pNew = fSimpleAnd ? Gia_ManDup( p ) : Gia_ManDupMuxes( p, 2 );
    Gia_ManTransferTiming( pNew, p );
    if ( fVerbose )      Gia_ManPrintStats( pNew, NULL );
    pNew1 = Gia_ManBalanceInt( pNew, fStrict );
    Gia_ManTransferTiming( pNew1, pNew );
    if ( fVerbose )      Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    pNew2 = Gia_ManDupNoMuxes( pNew1, 0 );
    Gia_ManTransferTiming( pNew2, pNew1 );
    if ( fVerbose )      Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    return pNew2;
}